

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

CppType __thiscall google::protobuf::MapValueConstRef::type(MapValueConstRef *this)

{
  LogMessage *this_00;
  LogMessage LStack_18;
  
  if ((this->type_ != 0) && (this->data_ != (void *)0x0)) {
    return this->type_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
             ,0x2b2);
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_18,(char (*) [34])"Protocol Buffer map usage error:\n");
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (this_00,(char (*) [60])"MapValueConstRef::type MapValueConstRef is not initialized.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == FieldDescriptor::CppType() || data_ == nullptr) {
      ABSL_LOG(FATAL)
          << "Protocol Buffer map usage error:\n"
          << "MapValueConstRef::type MapValueConstRef is not initialized.";
    }
    return type_;
  }